

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O1

ProductionPtr __thiscall
avro::parsing::ResolvingGrammarGenerator::resolveUnion
          (ResolvingGrammarGenerator *this,NodePtr *writer,NodePtr *reader,
          map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m,map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             *m2)

{
  pointer this_00;
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_count extraout_RDX;
  ulong uVar3;
  ProductionPtr PVar4;
  ProductionPtr p;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  v;
  Symbol local_70;
  element_type *local_60;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  local_58;
  map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *local_40;
  size_type __n;
  
  local_58.
  super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = m2;
  iVar2 = (*reader->px->_vptr_Node[4])();
  __n = CONCAT44(extraout_var,iVar2);
  std::
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ::reserve(&local_58,__n);
  local_60 = (element_type *)this;
  if (__n != 0) {
    uVar3 = 0;
    do {
      iVar2 = (*reader->px->_vptr_Node[5])(reader->px,uVar3 & 0xffffffff);
      doGenerate2((ResolvingGrammarGenerator *)&local_70,writer,
                  (NodePtr *)CONCAT44(extraout_var_00,iVar2),m,local_40);
      std::
      vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
      ::push_back(&local_58,(value_type *)&local_70);
      boost::detail::shared_count::~shared_count((shared_count *)&local_70.extra_);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  peVar1 = local_60;
  boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  this_00 = (peVar1->
            super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
            _M_impl.super__Vector_impl_data._M_start;
  Symbol::alternative(&local_70,&local_58);
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)this_00,
             &local_70);
  if (local_70.extra_.content != (placeholder *)0x0) {
    (*(local_70.extra_.content)->_vptr_placeholder[1])();
  }
  local_70.kind_ = sWriterUnion;
  local_70.extra_.content = (placeholder *)0x0;
  std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
  emplace_back<avro::parsing::Symbol>
            ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             (peVar1->
             super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_start,&local_70);
  if (local_70.extra_.content != (placeholder *)0x0) {
    (*(local_70.extra_.content)->_vptr_placeholder[1])();
  }
  std::
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ::~vector(&local_58);
  PVar4.pn.pi_ = extraout_RDX.pi_;
  PVar4.px = peVar1;
  return PVar4;
}

Assistant:

ProductionPtr ResolvingGrammarGenerator::resolveUnion(
    const NodePtr& writer, const NodePtr& reader,
    map<NodePair, ProductionPtr>& m,
    map<NodePtr, ProductionPtr>& m2)
{
    vector<ProductionPtr> v;
    size_t c = writer->leaves();
    v.reserve(c);
    for (size_t i = 0; i < c; ++i) {
        ProductionPtr p = doGenerate2(writer->leafAt(i), reader, m, m2);
        v.push_back(p);
    }
    ProductionPtr result = make_shared<Production>();
    result->push_back(Symbol::alternative(v));
    result->push_back(Symbol::writerUnionAction());
    return result;
}